

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O2

void cubeb_strings_destroy(cubeb_strings *strings)

{
  uint uVar1;
  char **ppcVar2;
  long lVar3;
  
  if (strings != (cubeb_strings *)0x0) {
    ppcVar2 = strings->data;
    uVar1 = strings->count;
    for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
      free(*(void **)((long)ppcVar2 + lVar3));
    }
    if (strings->data != strings->small_store) {
      free(strings->data);
    }
    free(strings);
    return;
  }
  return;
}

Assistant:

void
cubeb_strings_destroy(cubeb_strings * strings)
{
  char ** sp = NULL;
  char ** se = NULL;

  if (!strings) {
    return;
  }

  sp = strings->data;
  se = sp + strings->count;

  for (; sp != se; sp++) {
    if (*sp) {
      free(*sp);
    }
  }

  if (strings->data != strings->small_store) {
    free(strings->data);
  }

  free(strings);
}